

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

double __thiscall llvm::APInt::roundToDouble(APInt *this,bool isSigned)

{
  uint *puVar1;
  uint64_t X;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  int64_t iVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  APInt Tmp;
  anon_union_8_2_1313ab2f_for_U local_58 [2];
  double local_48;
  undefined8 uStack_40;
  APInt local_30;
  
  if ((0x40 < this->BitWidth) && (uVar4 = getActiveBits(this), 0x40 < uVar4)) {
    if ((isSigned) && (bVar2 = operator[](this,this->BitWidth - 1), bVar2)) {
      APInt(&local_30,this);
      operator-((llvm *)local_58,&local_30);
      ~APInt(&local_30);
      bVar6 = 1;
    }
    else {
      APInt((APInt *)local_58,this);
      bVar6 = 0;
    }
    uVar4 = getActiveBits((APInt *)local_58);
    if (uVar4 < 0x400) {
      if (uVar4 - 1 < 0x40) {
        uVar8 = *local_58[0].pVal;
        if (0x34 < uVar4) {
          uVar8 = uVar8 >> ((byte)uVar4 - 0x34 & 0x3f);
        }
      }
      else {
        uVar7 = uVar4 - 1 >> 6;
        bVar3 = (byte)uVar4 & 0x3f;
        uVar8 = ((ulong *)(local_58[0].VAL - 8))[uVar7] >> (bVar3 + 0xb & 0x3f) |
                local_58[0].pVal[uVar7] << (0x34 - bVar3 & 0x3f);
      }
      local_48 = (double)((ulong)(uVar4 + 0x3ff) << 0x34 | (ulong)bVar6 << 0x3f | uVar8);
    }
    else if ((bVar6 & isSigned) == 1) {
      local_48 = -INFINITY;
    }
    else {
      local_48 = INFINITY;
    }
    uStack_40 = 0;
    ~APInt((APInt *)local_58);
    return local_48;
  }
  puVar1 = &this->BitWidth;
  if (0x40 < *puVar1) {
    this = (APInt *)(this->U).VAL;
  }
  X = (this->U).VAL;
  if (isSigned) {
    iVar5 = SignExtend64(X,*puVar1);
    dVar9 = (double)iVar5;
  }
  else {
    auVar10._8_4_ = (int)(X >> 0x20);
    auVar10._0_8_ = X;
    auVar10._12_4_ = 0x45300000;
    dVar9 = (auVar10._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)X) - 4503599627370496.0);
  }
  return dVar9;
}

Assistant:

double APInt::roundToDouble(bool isSigned) const {

  // Handle the simple case where the value is contained in one uint64_t.
  // It is wrong to optimize getWord(0) to VAL; there might be more than one word.
  if (isSingleWord() || getActiveBits() <= APINT_BITS_PER_WORD) {
    if (isSigned) {
      int64_t sext = SignExtend64(getWord(0), BitWidth);
      return double(sext);
    } else
      return double(getWord(0));
  }

  // Determine if the value is negative.
  bool isNeg = isSigned ? (*this)[BitWidth-1] : false;

  // Construct the absolute value if we're negative.
  APInt Tmp(isNeg ? -(*this) : (*this));

  // Figure out how many bits we're using.
  unsigned n = Tmp.getActiveBits();

  // The exponent (without bias normalization) is just the number of bits
  // we are using. Note that the sign bit is gone since we constructed the
  // absolute value.
  uint64_t exp = n;

  // Return infinity for exponent overflow
  if (exp > 1023) {
    if (!isSigned || !isNeg)
      return std::numeric_limits<double>::infinity();
    else
      return -std::numeric_limits<double>::infinity();
  }
  exp += 1023; // Increment for 1023 bias

  // Number of bits in mantissa is 52. To obtain the mantissa value, we must
  // extract the high 52 bits from the correct words in pVal.
  uint64_t mantissa;
  unsigned hiWord = whichWord(n-1);
  if (hiWord == 0) {
    mantissa = Tmp.U.pVal[0];
    if (n > 52)
      mantissa >>= n - 52; // shift down, we want the top 52 bits.
  } else {
    assert(hiWord > 0 && "huh?");
    uint64_t hibits = Tmp.U.pVal[hiWord] << (52 - n % APINT_BITS_PER_WORD);
    uint64_t lobits = Tmp.U.pVal[hiWord-1] >> (11 + n % APINT_BITS_PER_WORD);
    mantissa = hibits | lobits;
  }

  // The leading bit of mantissa is implicit, so get rid of it.
  uint64_t sign = isNeg ? (1ULL << (APINT_BITS_PER_WORD - 1)) : 0;
  union {
    double D;
    uint64_t I;
  } T;
  T.I = sign | (exp << 52) | mantissa;
  return T.D;
}